

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Set_data64(int g_a,int ndim,int64_t *dims,int type)

{
  ulong uVar1;
  ulong ndim_00;
  Integer _ga_dims [7];
  Integer aIStack_38 [7];
  
  if (ndim < 1) {
    ndim_00 = (ulong)ndim;
  }
  else {
    ndim_00 = (ulong)(uint)ndim;
    uVar1 = ndim_00;
    do {
      aIStack_38[uVar1 - 1] = *dims;
      dims = dims + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  pnga_set_data((long)g_a,ndim_00,aIStack_38,(long)type);
  return;
}

Assistant:

void GA_Set_data64(int g_a, int ndim, int64_t dims[], int type)
{
    Integer aa, nndim, ttype;
    Integer _ga_dims[MAXDIM];
    COPYC2F(dims,_ga_dims, ndim);
    aa = (Integer)g_a;
    nndim = (Integer)ndim;
    ttype = (Integer)type;
    wnga_set_data(aa, nndim, _ga_dims, ttype);
}